

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall TPZManVector<int,_11>::Resize(TPZManVector<int,_11> *this,int64_t newsize)

{
  int *piVar1;
  long lVar2;
  ostream *poVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  
  if (-1 < newsize) {
    lVar5 = (this->super_TPZVec<int>).fNElements;
    if (lVar5 != newsize) {
      lVar2 = (this->super_TPZVec<int>).fNAlloc;
      if (lVar2 < newsize) {
        if ((ulong)newsize < 0xc) {
          piVar4 = (this->super_TPZVec<int>).fStore;
          piVar1 = this->fExtAlloc;
          if (piVar4 != piVar1) {
            lVar2 = 0;
            if (lVar5 < 1) {
              lVar5 = lVar2;
            }
            for (; lVar5 != lVar2; lVar2 = lVar2 + 1) {
              piVar1[lVar2] = piVar4[lVar2];
            }
            if (piVar4 != (int *)0x0) {
              operator_delete__(piVar4);
            }
            (this->super_TPZVec<int>).fStore = piVar1;
          }
          (this->super_TPZVec<int>).fNElements = newsize;
          (this->super_TPZVec<int>).fNAlloc = 0;
        }
        else {
          dVar7 = (double)lVar2 * 1.2;
          uVar6 = (long)dVar7;
          if (dVar7 < (double)newsize) {
            uVar6 = newsize;
          }
          lVar2 = 0;
          piVar4 = (int *)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
          piVar1 = (this->super_TPZVec<int>).fStore;
          if (lVar5 < 1) {
            lVar5 = lVar2;
          }
          for (; lVar5 != lVar2; lVar2 = lVar2 + 1) {
            piVar4[lVar2] = piVar1[lVar2];
          }
          if (piVar1 != (int *)0x0 && piVar1 != this->fExtAlloc) {
            operator_delete__(piVar1);
          }
          (this->super_TPZVec<int>).fStore = piVar4;
          (this->super_TPZVec<int>).fNElements = newsize;
          (this->super_TPZVec<int>).fNAlloc = uVar6;
        }
      }
      else {
        (this->super_TPZVec<int>).fNElements = newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}